

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
burst::algorithm::bitap<char,unsigned_int,std::array<unsigned_int,256ul>>::
active_search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (bitap<char,unsigned_int,std::array<unsigned_int,256ul>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          match_candidate,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_current,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_end,bitmask_type_conflict1 *hint)

{
  bool bVar1;
  uint uVar2;
  bitmask_type_conflict1 bVar3;
  bitmask_type bVar4;
  element_type *peVar5;
  size_t sVar6;
  reference pcVar7;
  bool bVar8;
  bitmask_type_conflict1 *match_column;
  uint match_indicator;
  bitmask_type_conflict1 *hint_local;
  bitap<char,_unsigned_int,_std::array<unsigned_int,_256UL>_> *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_end_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_current_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  match_candidate_local;
  
  this_local = (bitap<char,_unsigned_int,_std::array<unsigned_int,_256UL>_> *)corpus_end._M_current;
  corpus_end_local = corpus_current;
  corpus_current_local = match_candidate;
  peVar5 = std::
           __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  sVar6 = algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>::
          length(peVar5);
  uVar2 = left_shift<unsigned_int,unsigned_long>(1,sVar6 - 1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&corpus_end_local,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
    bVar8 = false;
    if (bVar1) {
      bVar8 = (*hint & uVar2) == 0;
    }
    if (!bVar8) break;
    bVar3 = bitap<char,_unsigned_int,_std::array<unsigned_int,_256UL>_>::bit_shift(*hint);
    peVar5 = std::
             __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pcVar7 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&corpus_end_local);
    bVar4 = algorithm::detail::element_position_bitmask_table<std::array<unsigned_int,_256UL>_>::
            operator[]<char>(peVar5,*pcVar7);
    *hint = bVar3 & bVar4;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&corpus_end_local);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&corpus_current_local);
  }
  if ((*hint & uVar2) == 0) {
    _match_candidate_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          )boost::
           make_iterator_range<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )this_local,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )this_local);
  }
  else {
    _match_candidate_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          )boost::
           make_iterator_range<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     (corpus_current_local,corpus_end_local);
  }
  return (iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
            )_match_candidate_local;
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }